

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscParserRoutines.cpp
# Opt level: O2

CNscPStackEntry * NscBuildTranslation(CNscPStackEntry *pList,CNscPStackEntry *pTranslation)

{
  if (pTranslation != (CNscPStackEntry *)0x0) {
    CNwnDoubleLinkList::InsertAfter(&pTranslation->m_link,&g_pCtx->m_listEntryFree);
  }
  return (CNscPStackEntry *)0x0;
}

Assistant:

YYSTYPE NscBuildTranslation (YYSTYPE pList, YYSTYPE pTranslation)
{
	pList;

	//
	// Free any entry (probably only declarations)
	//

	if (pTranslation)
        g_pCtx ->FreePStackEntry (pTranslation);

	//
	// Return the new expression
	//

	return NULL;
}